

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QStyleSheetImageData>::reset
          (QSharedDataPointer<QStyleSheetImageData> *this,QStyleSheetImageData *ptr)

{
  QStyleSheetImageData *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != ptr) {
    if (ptr != (QStyleSheetImageData *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar1 != (QStyleSheetImageData *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QIcon::~QIcon(&pQVar1->icon);
        operator_delete(pQVar1,0x20);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }